

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_rsa_fips186_4.c
# Opt level: O0

int bn_rsa_fips186_5_aux_prime_max_sum_size_for_prob_primes(int nbits)

{
  int nbits_local;
  undefined4 local_4;
  
  if (nbits < 0x1000) {
    if (nbits < 0xc00) {
      if (nbits < 0x800) {
        local_4 = 0;
      }
      else {
        local_4 = 0x3ef;
      }
    }
    else {
      local_4 = 0x5ee;
    }
  }
  else {
    local_4 = 0x7ee;
  }
  return local_4;
}

Assistant:

static int bn_rsa_fips186_5_aux_prime_max_sum_size_for_prob_primes(int nbits)
{
    if (nbits >= 4096)
        return 2030;
    if (nbits >= 3072)
        return 1518;
    if (nbits >= 2048)
        return 1007;
    return 0;
}